

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::InsertionOrderIndex::reserve(InsertionOrderIndex *this,size_t size)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  Link *to;
  Link *newLinks;
  Fault local_e8;
  Fault f_2;
  unsigned_long *local_d8;
  undefined1 local_d0 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition_2;
  Fault f_1;
  undefined1 local_98 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_1;
  size_t allocation;
  Fault local_58;
  Fault f;
  unsigned_long *local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long_&,_unsigned_int> _kjCondition;
  size_t size_local;
  InsertionOrderIndex *this_local;
  
  _kjCondition._32_8_ = size;
  local_48 = (unsigned_long *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_long *)&_kjCondition.result);
  f.exception._4_4_ = 0x80000000;
  kj::_::DebugExpression<unsigned_long&>::operator<
            ((DebugComparison<unsigned_long_&,_unsigned_int> *)local_40,
             (DebugExpression<unsigned_long&> *)&local_48,(uint *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int>&,char_const(&)[38]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x324,FAILED,"size < (1u << 31)",
               "_kjCondition,\"Table too big for InsertionOrderIndex\"",
               (DebugComparison<unsigned_long_&,_unsigned_int> *)local_40,
               (char (*) [38])"Table too big for InsertionOrderIndex");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  if ((ulong)this->capacity < (ulong)_kjCondition._32_8_) {
    uVar3 = kj::_::lg(_kjCondition._32_4_);
    _kjCondition_1._32_8_ = ZEXT48((uint)(1 << ((char)uVar3 + 1U & 0x1f)));
    f_1.exception =
         (Exception *)
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (unsigned_long *)&_kjCondition_1.result);
    kj::_::DebugExpression<unsigned_long&>::operator>
              ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_98,
               (DebugExpression<unsigned_long&> *)&f_1,(unsigned_long *)&_kjCondition.result);
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                ((Fault *)&_kjCondition_2.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x32c,FAILED,"allocation > size","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_98);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
    }
    local_d8 = (unsigned_long *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (unsigned_long *)&_kjCondition_1.result);
    f_2.exception = (Exception *)(_kjCondition._32_8_ << 1);
    kj::_::DebugExpression<unsigned_long&>::operator<=
              ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_d0,
               (DebugExpression<unsigned_long&> *)&local_d8,(unsigned_long *)&f_2);
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                (&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x32d,FAILED,"allocation <= size * 2","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_long> *)local_d0);
      kj::_::Debug::Fault::fatal(&local_e8);
    }
    newLinks._4_4_ = 8;
    _kjCondition_1._32_8_ =
         max<unsigned_long&,int>
                   ((unsigned_long *)&_kjCondition_1.result,(int *)((long)&newLinks + 4));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _kjCondition_1._32_8_;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    to = (Link *)operator_new__(uVar4);
    memset(to,0xff,_kjCondition_1._32_8_ << 3);
    kj::_::acopy<kj::InsertionOrderIndex::Link>(to,this->links,(ulong)(this->capacity + 1));
    if ((this->links != (Link *)&EMPTY_LINK) && (this->links != (Link *)0x0)) {
      operator_delete__(this->links);
    }
    this->links = to;
    this->capacity = _kjCondition_1._32_4_ - 1;
  }
  return;
}

Assistant:

void InsertionOrderIndex::reserve(size_t size) {
  KJ_ASSERT(size < (1u << 31), "Table too big for InsertionOrderIndex");

  if (size > capacity) {
    // Need to grow.
    // Note that `size` and `capacity` do not include the special link[0].

    // Round up to the next power of 2.
    size_t allocation = 1u << (_::lg(size) + 1);
    KJ_DASSERT(allocation > size);
    KJ_DASSERT(allocation <= size * 2);

    // Round first allocation up to 8.
    allocation = kj::max(allocation, 8);

    Link* newLinks = new Link[allocation];
#ifdef KJ_DEBUG
    // To catch bugs, fill unused links with 0xff.
    memset(newLinks, 0xff, allocation * sizeof(Link));
#endif
    _::acopy(newLinks, links, capacity + 1);
    if (links != &EMPTY_LINK) delete[] links;
    links = newLinks;
    capacity = allocation - 1;
  }
}